

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_rep_btree.h
# Opt level: O0

CordRepBtree * absl::lts_20250127::cord_internal::CordRepBtree::New(int height)

{
  CordRepBtree *this;
  CordRepBtree *tree;
  int height_local;
  
  this = (CordRepBtree *)operator_new(0x40);
  CordRepBtree(this);
  (this->super_CordRep).length = 0;
  InitInstance(this,height,0,0);
  return this;
}

Assistant:

inline CordRepBtree* CordRepBtree::New(int height) {
  CordRepBtree* tree = new CordRepBtree;
  tree->length = 0;
  tree->InitInstance(height);
  return tree;
}